

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

bool __thiscall NaPetriNet::prepare(NaPetriNet *this,bool bDoPrintouts)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *pFVar7;
  NaDataFile *pNVar8;
  size_t sVar9;
  char *pcVar10;
  NaPetriNode **ppNVar11;
  NaPetriConnector *pNVar12;
  undefined4 extraout_var;
  byte in_SIL;
  NaPetriNet *in_RDI;
  sigaction sa_old;
  sigaction sa;
  NaPetriNode *node_3;
  int iCn_5;
  NaException exCode_5;
  NaException exCode_4;
  NaException exCode_3;
  int iCn_4;
  NaException exCode_2;
  NaPetriNode *node_2;
  int iCn_3;
  NaException exCode_1;
  int iCn_2;
  NaPetriNode *node_1;
  uint nTotalDim;
  int iPass;
  uint nPrevDim;
  NaException exCode;
  NaPetriNode *node;
  int iCn_1;
  int iCn;
  char *title;
  char *msg;
  char *fname;
  char *szMapName;
  bool bFailed;
  int iNode;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  int in_stack_fffffffffffffbb8;
  NaBinaryDataType in_stack_fffffffffffffbbc;
  char *in_stack_fffffffffffffbc0;
  sigaction local_1e0;
  sigaction local_148;
  NaPetriNode *local_b0;
  int local_a8;
  int local_98;
  NaPetriNode *local_90;
  int local_84;
  int local_7c;
  NaPetriNode *local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  NaPetriNode *local_60;
  int local_58;
  int local_44;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  byte local_19;
  int local_18;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  if ((in_RDI->bPrepPrintout & 1U) != 0) {
    local_11 = in_RDI->bPrepPrintout & 1;
  }
  if (in_RDI->fpDig != (FILE *)0x0) {
    fprintf((FILE *)in_RDI->fpDig,"}\n");
    fclose((FILE *)in_RDI->fpDig);
    in_RDI->fpDig = (FILE *)0x0;
  }
  if ((in_RDI->bMapPrintout & 1U) != 0) {
    pcVar4 = name(in_RDI);
    sVar5 = strlen(pcVar4);
    pcVar4 = (char *)operator_new__(sVar5 + 5);
    local_28 = pcVar4;
    pcVar6 = name(in_RDI);
    sprintf(pcVar4,"%s.map",pcVar6);
    pFVar7 = fopen(local_28,"wt");
    in_RDI->fpMap = (FILE *)pFVar7;
    if (in_RDI->fpMap == (FILE *)0x0) {
      NaPrintLog("Failed to write activation map\n");
    }
    else {
      NaPrintLog("Activation map will be put to \'%s\'\n",local_28);
    }
    if (local_28 != (char *)0x0) {
      operator_delete__(local_28);
    }
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #0: preparation.\n",pcVar4);
  }
  in_RDI->iPrevIndex = -1;
  in_RDI->dfTimeChart = (NaDataFile *)0x0;
  if ((in_RDI->bTimeChart & 1U) != 0) {
    pcVar4 = name(in_RDI);
    sVar5 = strlen(pcVar4);
    pcVar4 = (char *)operator_new__(sVar5 + 5);
    local_30 = pcVar4;
    pcVar6 = name(in_RDI);
    sprintf(pcVar4,"%s.grf",pcVar6);
    if ((local_11 & 1) != 0) {
      NaPrintLog("Time chart is on -> %s.\n",local_30);
    }
    pNVar8 = OpenOutputDataFile(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                in_stack_fffffffffffffbb8);
    in_RDI->dfTimeChart = pNVar8;
    if (in_RDI->dfTimeChart == (NaDataFile *)0x0) {
      NaPrintLog("time chart file opening failed.\n");
    }
    else {
      local_38 = "Time chart for petri network \'%s\'";
      sVar5 = strlen("Time chart for petri network \'%s\'");
      pcVar4 = name(in_RDI);
      sVar9 = strlen(pcVar4);
      pcVar6 = (char *)operator_new__(sVar5 + sVar9);
      pcVar4 = local_38;
      local_40 = pcVar6;
      pcVar10 = name(in_RDI);
      sprintf(pcVar6,pcVar4,pcVar10);
      (*in_RDI->dfTimeChart->_vptr_NaDataFile[9])(in_RDI->dfTimeChart,0,"*TIME*");
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
    }
    if (local_30 != (char *)0x0) {
      operator_delete__(local_30);
    }
  }
  for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      iVar3 < iVar1; local_18 = local_18 + 1) {
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    (*ppNVar11)->bTunable = false;
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    (*ppNVar11)->nCalls = 0;
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    (*ppNVar11)->nActivations = 0;
    local_44 = 0;
    while( true ) {
      iVar3 = local_44;
      NaDynAr<NaPetriNode_*>::operator[]
                ((NaDynAr<NaPetriNode_*> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb8c);
      iVar1 = NaPetriNode::connectors((NaPetriNode *)0x157f8d);
      if (iVar1 <= iVar3) break;
      if ((local_11 & 1) != 0) {
        ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                             ((NaDynAr<NaPetriNode_*> *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                              in_stack_fffffffffffffb8c);
        pcVar4 = NaPetriNode::name(*ppNVar11);
        NaDynAr<NaPetriNode_*>::operator[]
                  ((NaDynAr<NaPetriNode_*> *)
                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   in_stack_fffffffffffffb8c);
        pNVar12 = NaPetriNode::connector
                            ((NaPetriNode *)
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                             in_stack_fffffffffffffb8c);
        pcVar6 = NaPetriConnector::name(pNVar12);
        NaPrintLog("node \'%s\', connector \'%s\'\n",pcVar4,pcVar6);
      }
      NaDynAr<NaPetriNode_*>::operator[]
                ((NaDynAr<NaPetriNode_*> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb8c);
      pNVar12 = NaPetriNode::connector
                          ((NaPetriNode *)
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                           in_stack_fffffffffffffb8c);
      (*pNVar12->_vptr_NaPetriConnector[4])();
      local_44 = local_44 + 1;
    }
    if (in_RDI->dfTimeChart != (NaDataFile *)0x0) {
      pNVar8 = in_RDI->dfTimeChart;
      uVar2 = local_18 + 1;
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      pcVar4 = NaPetriNode::name(*ppNVar11);
      (*pNVar8->_vptr_NaDataFile[9])(pNVar8,(ulong)uVar2,pcVar4);
    }
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #1: open input data.\n",pcVar4);
  }
  for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      iVar3 < iVar1; local_18 = local_18 + 1) {
    if ((local_11 & 1) != 0) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      pcVar4 = NaPetriNode::name(*ppNVar11);
      NaPrintLog("node \'%s\'\n",pcVar4);
    }
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    (*(*ppNVar11)->_vptr_NaPetriNode[0xb])();
    if ((local_11 & 1) != 0) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      uVar2 = (*(*ppNVar11)->_vptr_NaPetriNode[3])();
      if ((uVar2 & 1) != 0) {
        ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                             ((NaDynAr<NaPetriNode_*> *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                              in_stack_fffffffffffffb8c);
        local_60 = *ppNVar11;
        for (local_58 = 0; iVar3 = local_58,
            iVar1 = NaPetriNode::connectors((NaPetriNode *)0x158362), iVar3 < iVar1;
            local_58 = local_58 + 1) {
          pNVar12 = NaPetriNode::connector
                              ((NaPetriNode *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                               in_stack_fffffffffffffb8c);
          iVar3 = (*pNVar12->_vptr_NaPetriConnector[7])();
          if (iVar3 == 1) {
            NaPrintLog("  #%d ",(ulong)(local_58 + 1));
            pNVar12 = NaPetriNode::connector
                                ((NaPetriNode *)
                                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                 in_stack_fffffffffffffb8c);
            (*pNVar12->_vptr_NaPetriConnector[3])();
          }
        }
      }
    }
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #2: link connectors inside the node.\n",pcVar4);
  }
  local_68 = 0xffffffff;
  for (local_6c = 1; uVar2 = local_6c, iVar3 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      (int)uVar2 <= iVar3; local_6c = local_6c + 1) {
    NaPrintLog("## pass %u\n",(ulong)local_6c);
    local_70 = 0;
    for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
        iVar3 < iVar1; local_18 = local_18 + 1) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      local_78 = *ppNVar11;
      if ((local_11 & 1) != 0) {
        pcVar4 = NaPetriNode::name(local_78);
        NaPrintLog("node \'%s\'\n",pcVar4);
      }
      (*local_78->_vptr_NaPetriNode[0xc])();
      for (local_7c = 0; iVar3 = local_7c, iVar1 = NaPetriNode::connectors((NaPetriNode *)0x158698),
          iVar3 < iVar1; local_7c = local_7c + 1) {
        pNVar12 = NaPetriNode::connector
                            ((NaPetriNode *)
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                             in_stack_fffffffffffffb8c);
        iVar3 = (*pNVar12->_vptr_NaPetriConnector[8])();
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))();
        local_70 = iVar3 + local_70;
      }
      if (((local_11 & 1) != 0) && (uVar2 = (*local_78->_vptr_NaPetriNode[3])(), (uVar2 & 1) != 0))
      {
        for (local_7c = 0; iVar3 = local_7c,
            iVar1 = NaPetriNode::connectors((NaPetriNode *)0x15878f), iVar3 < iVar1;
            local_7c = local_7c + 1) {
          NaPrintLog("  #%d ",(ulong)(local_7c + 1));
          pNVar12 = NaPetriNode::connector
                              ((NaPetriNode *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                               in_stack_fffffffffffffb8c);
          (*pNVar12->_vptr_NaPetriConnector[3])();
        }
      }
    }
    NaPrintLog("## pass %u ==> total dim %u\n",(ulong)local_6c,(ulong)local_70);
    if (local_68 == local_70) break;
    local_68 = local_70;
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #3: open output data.\n",pcVar4);
  }
  for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      iVar3 < iVar1; local_18 = local_18 + 1) {
    if ((local_11 & 1) != 0) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      pcVar4 = NaPetriNode::name(*ppNVar11);
      NaPrintLog("node \'%s\'\n",pcVar4);
    }
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    (*(*ppNVar11)->_vptr_NaPetriNode[0xd])();
    if ((local_11 & 1) != 0) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      uVar2 = (*(*ppNVar11)->_vptr_NaPetriNode[3])();
      if ((uVar2 & 1) != 0) {
        ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                             ((NaDynAr<NaPetriNode_*> *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                              in_stack_fffffffffffffb8c);
        local_90 = *ppNVar11;
        for (local_84 = 0; iVar3 = local_84,
            iVar1 = NaPetriNode::connectors((NaPetriNode *)0x158b0a), iVar3 < iVar1;
            local_84 = local_84 + 1) {
          pNVar12 = NaPetriNode::connector
                              ((NaPetriNode *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                               in_stack_fffffffffffffb8c);
          iVar3 = (*pNVar12->_vptr_NaPetriConnector[7])();
          if (iVar3 == 0) {
            NaPrintLog("  #%d ",(ulong)(local_84 + 1));
            pNVar12 = NaPetriNode::connector
                                ((NaPetriNode *)
                                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                 in_stack_fffffffffffffb8c);
            (*pNVar12->_vptr_NaPetriConnector[3])();
          }
        }
      }
    }
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #4: allocate resources.\n",pcVar4);
  }
  for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      iVar3 < iVar1; local_18 = local_18 + 1) {
    local_98 = 0;
    while( true ) {
      iVar3 = local_98;
      NaDynAr<NaPetriNode_*>::operator[]
                ((NaDynAr<NaPetriNode_*> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb8c);
      iVar1 = NaPetriNode::connectors((NaPetriNode *)0x158c93);
      if (iVar1 <= iVar3) break;
      NaDynAr<NaPetriNode_*>::operator[]
                ((NaDynAr<NaPetriNode_*> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb8c);
      pNVar12 = NaPetriNode::connector
                          ((NaPetriNode *)
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                           in_stack_fffffffffffffb8c);
      (*pNVar12->_vptr_NaPetriConnector[5])();
      local_98 = local_98 + 1;
    }
  }
  for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      iVar3 < iVar1; local_18 = local_18 + 1) {
    if ((local_11 & 1) != 0) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      pcVar4 = NaPetriNode::name(*ppNVar11);
      NaPrintLog("node \'%s\'\n",pcVar4);
    }
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    (*(*ppNVar11)->_vptr_NaPetriNode[0xe])();
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("# net \'%s\', phase #5: verification.\n",pcVar4);
  }
  local_19 = 0;
  for (local_18 = 0; iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet),
      iVar3 < iVar1; local_18 = local_18 + 1) {
    if ((local_11 & 1) != 0) {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      pcVar4 = NaPetriNode::name(*ppNVar11);
      NaPrintLog("node \'%s\'\n",pcVar4);
    }
    ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                         ((NaDynAr<NaPetriNode_*> *)
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                          in_stack_fffffffffffffb8c);
    uVar2 = (*(*ppNVar11)->_vptr_NaPetriNode[0xf])();
    if ((uVar2 & 1) == 0) {
      local_19 = 1;
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      pcVar4 = NaPetriNode::name(*ppNVar11);
      NaPrintLog("Node \'%s\' verification failed!\n",pcVar4);
    }
  }
  if ((local_11 & 1) != 0) {
    pcVar4 = name(in_RDI);
    NaPrintLog("Petri net \'%s\' map:\n",pcVar4);
    local_18 = 0;
    while (iVar3 = local_18, iVar1 = NaDynAr<NaPetriNode_*>::count(&in_RDI->pnaNet), iVar3 < iVar1)
    {
      ppNVar11 = NaDynAr<NaPetriNode_*>::operator[]
                           ((NaDynAr<NaPetriNode_*> *)CONCAT44(iVar3,in_stack_fffffffffffffb90),
                            in_stack_fffffffffffffb8c);
      local_b0 = *ppNVar11;
      pcVar4 = NaPetriNode::name(local_b0);
      NaPrintLog("* node \'%s\', connectors:\n",pcVar4);
      local_a8 = 0;
      while (in_stack_fffffffffffffb90 = local_a8,
            iVar1 = NaPetriNode::connectors((NaPetriNode *)0x15936d),
            in_stack_fffffffffffffb90 < iVar1) {
        NaPrintLog("  #%d ",(ulong)(local_a8 + 1));
        pNVar12 = NaPetriNode::connector
                            ((NaPetriNode *)CONCAT44(iVar3,in_stack_fffffffffffffb90),
                             in_stack_fffffffffffffb8c);
        (*pNVar12->_vptr_NaPetriConnector[3])();
        local_a8 = local_a8 + 1;
      }
      local_18 = local_18 + 1;
    }
  }
  if ((local_19 & 1) == 0) {
    if ((local_11 & 1) != 0) {
      pcVar4 = name(in_RDI);
      NaPrintLog("# net \'%s\', phase #6: initialization.\n",pcVar4);
    }
    (*in_RDI->_vptr_NaPetriNet[4])(in_RDI,(ulong)local_11 & 1);
    bUserBreak = false;
    local_148.__sigaction_handler.sa_handler = user_break;
    local_148.sa_flags = -0x80000000;
    sigaction(2,&local_148,&local_1e0);
    sigaction(0xf,&local_148,&local_1e0);
    sigaction(3,&local_148,&local_1e0);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
NaPetriNet::prepare (bool bDoPrintouts)
{
    int     iNode;
    bool    bFailed;

    if(bPrepPrintout)
      bDoPrintouts = bPrepPrintout;

    if(NULL != fpDig) {
	// Digraph is created already
	fprintf(fpDig, "}\n");
	fclose(fpDig);
	fpDig = NULL;
    }

    /* Create activation map file */
    if(bMapPrintout){
      char	*szMapName = new char[strlen(name()) + sizeof(".map")];
      sprintf(szMapName, "%s.map", name());
      fpMap = fopen(szMapName, "wt");
      if(NULL == fpMap){
	NaPrintLog("Failed to write activation map\n");
      }else{
	NaPrintLog("Activation map will be put to '%s'\n", szMapName);
      }
      delete[] szMapName;
    }

    // Do preparation phases

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #0: preparation.\n", name());
    }

    iPrevIndex = -1;
    dfTimeChart = NULL;
    if(bTimeChart){
        char    *fname = new char[strlen(name()) + sizeof(".grf")];
        sprintf(fname, "%s.grf", name());

        if(bDoPrintouts){
            NaPrintLog("Time chart is on -> %s.\n", fname);
        }

        dfTimeChart = OpenOutputDataFile(fname);
        if(NULL == dfTimeChart){
            NaPrintLog("time chart file opening failed.\n");
        }else{
	    const char    *msg = "Time chart for petri network '%s'";
            char    *title = new char[strlen(msg) + strlen(name())];
            sprintf(title, msg, name());
            dfTimeChart->SetVarName(0, "*TIME*");
	    delete[] title;
        }

	delete[] fname;
    }

    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Disallow changes of node parameters
        pnaNet[iNode]->bTunable = false;

        // Setup 0 past calls for node activity
        pnaNet[iNode]->nCalls = 0;

        // Setup 0 past activations of node
        pnaNet[iNode]->nActivations = 0;

        // Need to initialize connectors
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
            if(bDoPrintouts){
                NaPrintLog("node '%s', connector '%s'\n",
                           pnaNet[iNode]->name(),
                           pnaNet[iNode]->connector(iCn)->name());
            }
            pnaNet[iNode]->connector(iCn)->init();
        }

        // Add node to time chart
        if(NULL != dfTimeChart){
            dfTimeChart->SetVarName(1 + iNode, pnaNet[iNode]->name());
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #1: open input data.\n", name());
    }

    // 1. Open input data (pure output nodes) and get their dimensions
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->open_input_data();

	    /* describe only output connectors */
	    if(bDoPrintouts && pnaNet[iNode]->is_verbose()){
	      int	iCn;
	      NaPetriNode	&node = *pnaNet[iNode];

	      for(iCn = 0; iCn < node.connectors(); ++iCn){
		if(pckOutput == node.connector(iCn)->kind()){
		  NaPrintLog("  #%d ", iCn + 1);
		  node.connector(iCn)->describe();
		}
	      }
	    }
        }catch(NaException exCode){
            NaPrintLog("Open input data phase (#1): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #2: link connectors inside the node.\n",
                   name());
    }

    // 2. Link connectors inside the node
    unsigned nPrevDim = (unsigned)(-1);
    // Not more passes than number of nodes
    for(int iPass = 1; iPass <= pnaNet.count(); ++iPass){
      NaPrintLog("## pass %u\n", iPass);

      unsigned nTotalDim = 0;
      for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
	  NaPetriNode	&node = *pnaNet[iNode];

            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", node.name());
            }
            node.relate_connectors();

	    int	iCn;
	    for(iCn = 0; iCn < node.connectors(); ++iCn){
	      nTotalDim += node.connector(iCn)->data().dim();
	    }

	    /* describe all connectors */
	    if(bDoPrintouts && node.is_verbose()){
	      for(iCn = 0; iCn < node.connectors(); ++iCn){
		NaPrintLog("  #%d ", iCn + 1);
		node.connector(iCn)->describe();
	      }
	    }

        }catch(NaException exCode){
            NaPrintLog("Link connectors phase (#2): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
      } // for nodes

      NaPrintLog("## pass %u ==> total dim %u\n", iPass, nTotalDim);

      // Iterate until dimensions became stable
      if(nPrevDim == nTotalDim)
	break;

      nPrevDim = nTotalDim;

    } // for passes

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #3: open output data.\n", name());
    }

    // 3. Open output data (pure input nodes) and set their dimensions
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->open_output_data();

	    /* describe only input connectors */
	    if(bDoPrintouts && pnaNet[iNode]->is_verbose()){
	      int	iCn;
	      NaPetriNode	&node = *pnaNet[iNode];

	      for(iCn = 0; iCn < node.connectors(); ++iCn){
		if(pckInput == node.connector(iCn)->kind()){
		  NaPrintLog("  #%d ", iCn + 1);
		  node.connector(iCn)->describe();
		}
	      }
	    }
        }catch(NaException exCode){
            NaPrintLog("Open output data phase (#3): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #4: allocate resources.\n", name());
    }

    // Call dim_ready() for each connector
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Need to setup connections
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
	  try{
            pnaNet[iNode]->connector(iCn)->dim_ready();
	  }catch(NaException exCode){
            NaPrintLog("Failure at %s.%s.%s.dim_ready().\n"
                       "Caused by exception: %s\n",
		       name(), pnaNet[iNode]->name(),
		       pnaNet[iNode]->connector(iCn)->name(),
		       NaExceptionMsg(exCode));
	  }
        }
    }

    // 4. Allocate resources for internal usage
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->allocate_resources();
        }catch(NaException exCode){
            NaPrintLog("Allocate resources phase (#4): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #5: verification.\n", name());
    }

    // 5. Verification to be sure all is OK (true)
    bFailed = false;
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            if(!pnaNet[iNode]->verify()){
                bFailed = bFailed || true;
                NaPrintLog("Node '%s' verification failed!\n",
                           pnaNet[iNode]->name());
            }
        }catch(NaException exCode){
            bFailed = bFailed || true;
            NaPrintLog("Verification phase (#5): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("Petri net '%s' map:\n", name());
        for(iNode = 0; iNode < pnaNet.count(); ++iNode){
            int         iCn;
            NaPetriNode &node = *pnaNet[iNode];

            NaPrintLog("* node '%s', connectors:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
                NaPrintLog("  #%d ", iCn + 1);
                node.connector(iCn)->describe();
            }
        }
    }

    if(bFailed){
        return false;
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #6: initialization.\n", name());
    }

    // 6. Initialize node activity and setup starter flag if needed
    initialize(bDoPrintouts);

#if defined(unix)
    // Prepare value of handling user break
    bUserBreak = false;

    // Register the signal handler
    struct sigaction	sa, sa_old;
    sa.sa_handler = user_break;
    sa.sa_flags = SA_ONESHOT;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
#endif /* unix */

    return true;
}